

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

void __thiscall google::protobuf::Arena::Init(Arena *this)

{
  Block *block;
  AtomicWord AVar1;
  LogMessage *pLVar2;
  ThreadCache *pTVar3;
  undefined8 uVar4;
  Block *first_block;
  byte local_49;
  LogMessage local_48;
  Arena *local_10;
  Arena *this_local;
  
  local_10 = this;
  AVar1 = internal::SequenceNumber::GetNext((SequenceNumber *)&lifecycle_id_generator_);
  *(AtomicWord *)this = AVar1;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  this[0x28] = (Arena)0x1;
  *(undefined8 *)(this + 0x20) = 0;
  if ((*(long *)(this + 0x50) != 0) && (*(long *)(this + 0x58) != 0)) {
    local_49 = 0;
    if (*(ulong *)(this + 0x58) < 0x20) {
      internal::LogMessage::LogMessage
                (&local_48,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/arena.cc"
                 ,0x46);
      local_49 = 1;
      pLVar2 = internal::LogMessage::operator<<
                         (&local_48,
                          "CHECK failed: (options_.initial_block_size) >= (sizeof(Block)): ");
      pLVar2 = internal::LogMessage::operator<<(pLVar2,": Initial block size too small for header.")
      ;
      internal::LogFinisher::operator=((LogFinisher *)((long)&first_block + 3),pLVar2);
    }
    if ((local_49 & 1) != 0) {
      internal::LogMessage::~LogMessage(&local_48);
    }
    block = *(Block **)(this + 0x50);
    block->size = *(size_t *)(this + 0x58);
    block->pos = 0x20;
    block->next = (Block *)0x0;
    pTVar3 = thread_cache();
    block->owner = pTVar3;
    SetThreadCacheBlock(this,block);
    AddBlockInternal(this,block);
    this[0x28] = (Arena)0x0;
  }
  if (*(long *)(this + 0x70) == 0) {
    *(undefined8 *)(this + 0x38) = 0;
  }
  else {
    uVar4 = (**(code **)(this + 0x70))(this);
    *(undefined8 *)(this + 0x38) = uVar4;
  }
  return;
}

Assistant:

void Arena::Init() {
  lifecycle_id_ = lifecycle_id_generator_.GetNext();
  blocks_ = 0;
  hint_ = 0;
  space_allocated_ = 0;
  owns_first_block_ = true;
  cleanup_list_ = 0;

  if (options_.initial_block != NULL && options_.initial_block_size > 0) {
    GOOGLE_CHECK_GE(options_.initial_block_size, sizeof(Block))
        << ": Initial block size too small for header.";

    // Add first unowned block to list.
    Block* first_block = reinterpret_cast<Block*>(options_.initial_block);
    first_block->size = options_.initial_block_size;
    first_block->pos = kHeaderSize;
    first_block->next = NULL;
    // Thread which calls Init() owns the first block. This allows the
    // single-threaded case to allocate on the first block without taking any
    // locks.
    first_block->owner = &thread_cache();
    SetThreadCacheBlock(first_block);
    AddBlockInternal(first_block);
    owns_first_block_ = false;
  }

  // Call the initialization hook
  if (options_.on_arena_init != NULL) {
    hooks_cookie_ = options_.on_arena_init(this);
  } else {
    hooks_cookie_ = NULL;
  }
}